

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O1

bool __thiscall
google::protobuf::io::CodedInputStream::DecrementRecursionDepthAndPopLimit
          (CodedInputStream *this,Limit limit)

{
  bool bVar1;
  int iVar2;
  uint8_t *puVar3;
  Nonnull<const_char_*> pcVar4;
  int iVar5;
  
  bVar1 = this->legitimate_message_end_;
  this->current_limit_ = limit;
  iVar2 = this->buffer_size_after_limit_;
  puVar3 = this->buffer_end_;
  this->buffer_end_ = puVar3 + iVar2;
  if (this->total_bytes_limit_ < limit) {
    limit = this->total_bytes_limit_;
  }
  iVar5 = this->total_bytes_read_ - limit;
  if (iVar5 == 0 || this->total_bytes_read_ < limit) {
    this->buffer_size_after_limit_ = 0;
  }
  else {
    this->buffer_size_after_limit_ = iVar5;
    this->buffer_end_ = puVar3 + iVar2 + -(long)iVar5;
  }
  this->legitimate_message_end_ = false;
  if (this->recursion_budget_ < this->recursion_limit_) {
    pcVar4 = (Nonnull<const_char_*>)0x0;
  }
  else {
    pcVar4 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                       ((long)this->recursion_budget_,(long)this->recursion_limit_,
                        "recursion_budget_ < recursion_limit_");
  }
  if (pcVar4 == (Nonnull<const_char_*>)0x0) {
    this->recursion_budget_ = this->recursion_budget_ + 1;
    return bVar1;
  }
  DecrementRecursionDepthAndPopLimit();
}

Assistant:

bool CodedInputStream::DecrementRecursionDepthAndPopLimit(Limit limit) {
  bool result = ConsumedEntireMessage();
  PopLimit(limit);
  ABSL_DCHECK_LT(recursion_budget_, recursion_limit_);
  ++recursion_budget_;
  return result;
}